

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::synchronization::anon_unknown_0::PipelineCacheComputeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PipelineCacheComputeTestInstance *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  VkDevice device;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  long *plVar4;
  Allocator *allocator;
  pointer pcVar5;
  undefined4 uVar6;
  DeviceInterface *pDVar7;
  pointer pSVar8;
  deUint32 dVar9;
  deUint64 *pdVar10;
  const_iterator cVar11;
  long *plVar12;
  int *piVar13;
  DescriptorSetLayoutBuilder *this_01;
  ThreadGroupThread *this_02;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  VkComputePipelineCreateInfo *pVVar18;
  iterator iVar19;
  long lVar20;
  byte bVar21;
  vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  pipelineInfo;
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  shaderStageInfos;
  Move<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  Buffer resultBuffer;
  ThreadGroup threads;
  ShaderModuleVector shaderCompModules;
  MovePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  queues;
  Move<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)15>_> pipelineCache;
  Move<vk::Handle<(vk::HandleType)18>_> pipeline;
  VkPipelineCacheCreateInfo pipelineCacheInfo;
  VkComputePipelineCreateInfo *local_358;
  iterator iStack_350;
  VkComputePipelineCreateInfo *local_348;
  void *local_338;
  iterator iStack_330;
  VkPipelineShaderStageCreateInfo *local_328;
  DeviceInterface *local_320;
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  Buffer local_2f8;
  MovePtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
  local_2c8;
  ThreadGroup local_2b8;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  local_298;
  PipelineCacheComputeTestInstance *local_278;
  DeviceInterface *local_270;
  long *local_268;
  long local_260;
  long local_258 [2];
  UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  local_248;
  Move<vk::Handle<(vk::HandleType)16>_> local_238;
  Move<vk::Handle<(vk::HandleType)15>_> local_218;
  Move<vk::Handle<(vk::HandleType)18>_> local_1f8;
  undefined1 local_1d8 [16];
  pointer local_1c8;
  VkShaderModule VStack_1c0;
  pointer local_1b8;
  VkSpecializationInfo *pVStack_1b0;
  VkShaderModule local_1a8;
  pointer local_1a0;
  VkSpecializationInfo *pVStack_198;
  VkPipelineLayout local_190;
  VkPipeline local_188;
  deInt32 local_180;
  ios_base local_168 [272];
  TestStatus local_58;
  
  bVar21 = 0;
  local_320 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_1d8._0_4_ = 2;
  createQueues((MovePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                *)&local_248,(this->super_TestInstance).m_context,(VkQueueFlags *)local_1d8);
  device = ((local_248.m_data.ptr)->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_270 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_298.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::resize(&local_298,
           (long)(this->m_shadersExecutions).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->m_shadersExecutions).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2);
  if (0 < (int)((ulong)((long)(this->m_shadersExecutions).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_shadersExecutions).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    lVar17 = 8;
    lVar20 = 0;
    local_278 = this;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"compute_",8);
      std::ostream::operator<<((ostringstream *)local_1d8,(int)lVar20);
      pdVar10 = (deUint64 *)operator_new(0x20);
      this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 *)((this->super_TestInstance).m_context)->m_progCollection;
      std::__cxx11::stringbuf::str();
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find(this_00,(key_type *)local_318);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_2f8,local_270,device,
                 *(ProgramBinary **)(cVar11._M_node + 2),0);
      pdVar10[2] = (deUint64)
                   local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                   m_device;
      pdVar10[3] = (deUint64)
                   local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                   m_allocator;
      *pdVar10 = local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal;
      pdVar10[1] = (deUint64)
                   local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                   m_deviceIface;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)0x0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      plVar12 = (long *)operator_new(0x20);
      pSVar8 = local_298.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar12 + 1) = 0;
      *(undefined4 *)((long)plVar12 + 0xc) = 0;
      *plVar12 = (long)&PTR__SharedPtrState_00d1dfd0;
      plVar12[2] = (long)pdVar10;
      *(undefined4 *)(plVar12 + 1) = 1;
      *(undefined4 *)((long)plVar12 + 0xc) = 1;
      plVar4 = *(long **)((long)&(local_298.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar17);
      if (plVar4 != plVar12) {
        if (plVar4 != (long *)0x0) {
          LOCK();
          plVar4 = plVar4 + 1;
          *(int *)plVar4 = (int)*plVar4 + -1;
          UNLOCK();
          if ((int)*plVar4 == 0) {
            *(undefined8 *)
             ((long)local_298.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8) = 0;
            (**(code **)(**(long **)((long)&(local_298.
                                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                    lVar17) + 0x10))();
          }
          LOCK();
          piVar13 = (int *)(*(long *)((long)&pSVar8->m_ptr + lVar17) + 0xc);
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            plVar4 = *(long **)((long)&pSVar8->m_ptr + lVar17);
            if (plVar4 != (long *)0x0) {
              (**(code **)(*plVar4 + 8))();
            }
            *(undefined8 *)((long)&pSVar8->m_ptr + lVar17) = 0;
          }
        }
        *(deUint64 **)((long)pSVar8 + lVar17 + -8) = pdVar10;
        *(long **)((long)&pSVar8->m_ptr + lVar17) = plVar12;
        LOCK();
        *(int *)(plVar12 + 1) = (int)plVar12[1] + 1;
        UNLOCK();
        LOCK();
        piVar13 = (int *)(*(long *)((long)&pSVar8->m_ptr + lVar17) + 0xc);
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      plVar4 = plVar12 + 1;
      LOCK();
      *(int *)plVar4 = (int)*plVar4 + -1;
      UNLOCK();
      if ((int)*plVar4 == 0) {
        (**(code **)(*plVar12 + 0x10))(plVar12);
      }
      piVar13 = (int *)((long)plVar12 + 0xc);
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        (**(code **)(*plVar12 + 8))(plVar12);
      }
      this = local_278;
      if (local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
          != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
                   &local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                   (VkShaderModule)
                   local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                   m_internal);
      }
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
      local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._0_8_ != &local_308) {
        operator_delete((void *)local_318._0_8_,local_308._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar20 < (int)((ulong)((long)(this->m_shadersExecutions).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_shadersExecutions).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  allocator = ((local_248.m_data.ptr)->m_allocator).
              super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_1d8,0x40,0x20);
  synchronization::Buffer::Buffer
            (&local_2f8,local_320,device,allocator,(VkBufferCreateInfo *)local_1d8,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_1d8);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)local_1d8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,
                       0x20,(VkSampler *)0x0);
  pDVar7 = local_320;
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_318,this_01,local_320,device,0);
  if ((pointer)local_1a8.m_internal != (pointer)0x0) {
    operator_delete((void *)local_1a8.m_internal,(long)pVStack_198 - local_1a8.m_internal);
  }
  if ((pointer)VStack_1c0.m_internal != (pointer)0x0) {
    operator_delete((void *)VStack_1c0.m_internal,(long)pVStack_1b0 - VStack_1c0.m_internal);
  }
  if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._0_8_,(long)local_1c8 - local_1d8._0_8_);
  }
  makePipelineLayout(&local_238,pDVar7,device,(VkDescriptorSetLayout)local_318._0_8_);
  local_338 = (void *)0x0;
  iStack_330._M_current = (VkPipelineShaderStageCreateInfo *)0x0;
  local_328 = (VkPipelineShaderStageCreateInfo *)0x0;
  local_1d8._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_1d8._8_8_ = (pointer)0x0;
  local_1c8 = (pointer)0x2000000000;
  local_1b8 = (pointer)0xaed455;
  pVStack_1b0 = (VkSpecializationInfo *)0x0;
  if (0 < (int)((ulong)((long)(this->m_shadersExecutions).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_shadersExecutions).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    lVar17 = 0;
    lVar20 = 0;
    do {
      VStack_1c0.m_internal =
           **(deUint64 **)
             ((long)&(local_298.
                      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar17);
      if (iStack_330._M_current == local_328) {
        std::
        vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
        ::_M_realloc_insert<vk::VkPipelineShaderStageCreateInfo_const&>
                  ((vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
                    *)&local_338,iStack_330,(VkPipelineShaderStageCreateInfo *)local_1d8);
      }
      else {
        (iStack_330._M_current)->pName = (char *)local_1b8;
        (iStack_330._M_current)->pSpecializationInfo = pVStack_1b0;
        *(pointer *)&(iStack_330._M_current)->flags = local_1c8;
        ((iStack_330._M_current)->module).m_internal = VStack_1c0.m_internal;
        *(undefined8 *)iStack_330._M_current = local_1d8._0_8_;
        (iStack_330._M_current)->pNext = (void *)local_1d8._8_8_;
        iStack_330._M_current = iStack_330._M_current + 1;
      }
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar20 < (int)((ulong)((long)(this->m_shadersExecutions).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_shadersExecutions).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  local_358 = (VkComputePipelineCreateInfo *)0x0;
  iStack_350._M_current = (VkComputePipelineCreateInfo *)0x0;
  local_348 = (VkComputePipelineCreateInfo *)0x0;
  local_1d8._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_1d8._8_8_ = (pointer)0x0;
  local_1c8 = (pointer)((ulong)local_1c8 & 0xffffffff00000000);
  local_190.m_internal =
       local_238.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  local_188.m_internal = 0;
  local_180 = 0;
  if (0 < (int)((ulong)((long)(this->m_shadersExecutions).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_shadersExecutions).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    lVar20 = 0;
    lVar17 = 0;
    do {
      puVar2 = (undefined8 *)((long)local_338 + lVar20 + 0x10);
      puVar3 = (undefined8 *)((long)local_338 + lVar20 + 0x20);
      local_1a0 = (pointer)*puVar3;
      pVStack_198 = (VkSpecializationInfo *)puVar3[1];
      pVStack_1b0 = (VkSpecializationInfo *)*puVar2;
      local_1a8.m_internal = (deUint64)puVar2[1];
      VStack_1c0.m_internal = (deUint64)*(pointer *)((long)local_338 + lVar20);
      local_1b8 = (pointer)((VkDeviceSize *)((long)local_338 + lVar20))[1];
      if (iStack_350._M_current == local_348) {
        std::vector<vk::VkComputePipelineCreateInfo,std::allocator<vk::VkComputePipelineCreateInfo>>
        ::_M_realloc_insert<vk::VkComputePipelineCreateInfo_const&>
                  ((vector<vk::VkComputePipelineCreateInfo,std::allocator<vk::VkComputePipelineCreateInfo>>
                    *)&local_358,iStack_350,(VkComputePipelineCreateInfo *)local_1d8);
      }
      else {
        pVVar18 = (VkComputePipelineCreateInfo *)local_1d8;
        iVar19._M_current = iStack_350._M_current;
        for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
          uVar6 = *(undefined4 *)&pVVar18->field_0x4;
          (iVar19._M_current)->sType = pVVar18->sType;
          *(undefined4 *)&(iVar19._M_current)->field_0x4 = uVar6;
          pVVar18 = (VkComputePipelineCreateInfo *)((long)pVVar18 + (ulong)bVar21 * -0x10 + 8);
          iVar19._M_current = iVar19._M_current + (ulong)bVar21 * -0x10 + 8;
        }
        iStack_350._M_current = iStack_350._M_current + 1;
      }
      lVar17 = lVar17 + 1;
      lVar20 = lVar20 + 0x30;
    } while (lVar17 < (int)((ulong)((long)(this->m_shadersExecutions).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_shadersExecutions).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  pDVar7 = local_320;
  local_1d8._8_8_ = (pointer)0x0;
  local_1c8 = (pointer)0x0;
  VStack_1c0.m_internal = 0;
  local_1b8 = (pointer)0x0;
  local_1d8._0_8_ = (pointer)0x11;
  ::vk::createPipelineCache
            (&local_218,local_320,device,(VkPipelineCacheCreateInfo *)local_1d8,
             (VkAllocationCallbacks *)0x0);
  ::vk::createComputePipeline
            (&local_1f8,pDVar7,device,
             (VkPipelineCache)
             local_218.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
             local_358,(VkAllocationCallbacks *)0x0);
  dVar9 = deGetNumAvailableLogicalCores();
  uVar14 = 0x20;
  if (dVar9 < 0x20) {
    uVar14 = dVar9;
  }
  uVar16 = 4;
  if (4 < uVar14) {
    uVar16 = uVar14;
  }
  local_2b8.m_threads.
  super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.m_threads.
  super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.m_threads.
  super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  executeComputePipeline
            (&local_58,(this->super_TestInstance).m_context,(VkPipeline *)&local_1f8,
             (VkPipelineLayout *)&local_238,(VkDescriptorSetLayout *)local_318,local_248.m_data.ptr,
             (this->m_shadersExecutions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_description._M_dataplus._M_p != &local_58.m_description.field_2) {
    operator_delete(local_58.m_description._M_dataplus._M_p,
                    local_58.m_description.field_2._M_allocated_capacity + 1);
  }
  do {
    this_02 = (ThreadGroupThread *)operator_new(0xa0);
    ThreadGroupThread::ThreadGroupThread
              (this_02,(this->super_TestInstance).m_context,
               (VkPipelineCache)
               local_218.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
               (VkPipelineLayout *)&local_238,(VkDescriptorSetLayout *)local_318,
               local_248.m_data.ptr,&this->m_shadersExecutions);
    (this_02->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00d312a8;
    this_02[1].super_Thread._vptr_Thread = (_func_int **)&local_358;
    local_2c8.
    super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this_02;
    ThreadGroup::add(&local_2b8,&local_2c8);
    if (local_2c8.
        super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_2c8.
          super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_2c8.
      super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    uVar16 = uVar16 - 1;
  } while (uVar16 != 0);
  ThreadGroup::run(__return_storage_ptr__,&local_2b8);
  if (__return_storage_ptr__->m_code == QP_TEST_RESULT_PASS) {
    pcVar5 = (__return_storage_ptr__->m_description)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_description).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    local_268 = local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Passed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_268,
               local_260 + (long)local_268);
    if (local_268 != local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
  }
  ThreadGroup::~ThreadGroup(&local_2b8);
  if (local_1f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_1f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_1f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (local_218.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()
              (&local_218.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter,
               (VkPipelineCache)
               local_218.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal);
  }
  if (local_358 != (VkComputePipelineCreateInfo *)0x0) {
    operator_delete(local_358,(long)local_348 - (long)local_358);
  }
  if (local_338 != (void *)0x0) {
    operator_delete(local_338,(long)local_328 - (long)local_338);
  }
  if (local_238.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&local_238.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
               (VkPipelineLayout)
               local_238.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
  }
  if ((pointer)local_318._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_318 + 8),
               (VkDescriptorSetLayout)local_318._0_8_);
  }
  if (local_2f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_2f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_2f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_2f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::~vector(&local_298);
  de::details::
  UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  ::~UniqueBase(&local_248);
  return __return_storage_ptr__;
}

Assistant:

TestStatus	iterate								(void)
	{
		const DeviceInterface&					vk					= m_context.getDeviceInterface();
		MovePtr<MultiQueues>					queues				= createQueues(m_context, VK_QUEUE_COMPUTE_BIT);
		const VkDevice							device				= queues->getDevice();
		ShaderModuleVector						shaderCompModules	= addShaderModules(device);
		Buffer									resultBuffer		(vk, device, *queues->m_allocator, makeBufferCreateInfo(BUFFER_SIZE, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);
		const Move<VkDescriptorSetLayout>		descriptorSetLayout	(DescriptorSetLayoutBuilder()
																		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
																		.build(vk, device));
		const Move<VkPipelineLayout>			pipelineLayout		(makePipelineLayout(vk, device, *descriptorSetLayout));
		vector<VkPipelineShaderStageCreateInfo>	shaderStageInfos	= addShaderStageInfo(shaderCompModules);
		vector<VkComputePipelineCreateInfo>		pipelineInfo		= addPipelineInfo(*pipelineLayout, shaderStageInfos);
		const VkPipelineCacheCreateInfo			pipelineCacheInfo	=
																	{
																		VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO,	// VkStructureType             sType;
																		DE_NULL,										// const void*                 pNext;
																		0u,												// VkPipelineCacheCreateFlags  flags;
																		0u,												// deUintptr                   initialDataSize;
																		DE_NULL,										// const void*                 pInitialData;
																	};
		Move<VkPipelineCache>					pipelineCache		= createPipelineCache(vk, device, &pipelineCacheInfo);
		Move<VkPipeline>						pipeline			= createComputePipeline(vk, device, *pipelineCache, &pipelineInfo[0]);
		const deUint32							numThreads			= clamp(deGetNumAvailableLogicalCores(), 4u, 32u);
		ThreadGroup								threads;

		executeComputePipeline(m_context, *pipeline, *pipelineLayout, *descriptorSetLayout, *queues, m_shadersExecutions[0]);

		for (deUint32 ndx = 0; ndx < numThreads; ++ndx)
			threads.add(MovePtr<ThreadGroupThread>(new CreateComputeThread(
				m_context, *pipelineCache, pipelineInfo, *pipelineLayout, *descriptorSetLayout, *queues, m_shadersExecutions)));

		{
			TestStatus thread_result = threads.run();
			if(thread_result.getCode())
			{
				return thread_result;
			}
		}
		return TestStatus::pass("Passed");
	}